

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn2>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,yarn2 *r1,yarn2 *r2,long N,long skip1,long skip2)

{
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>> *p_Var1
  ;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  uint local_9c;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  long local_58;
  long local_50;
  long local_48;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_40;
  long local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58 = skip1;
  local_50 = skip2;
  local_40 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98,N);
    lVar4 = 0;
    do {
      iVar9 = (r1->S).r[0];
      uVar6 = (long)(r1->S).r[1] * (long)(r1->P).a[1] + (long)(r1->P).a[0] * (long)iVar9;
      uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
      uVar6 = uVar7 - 0xfffffffe;
      if (uVar7 < 0xfffffffe) {
        uVar6 = uVar7;
      }
      uVar3 = (uint)uVar6 + 0x80000001;
      if (uVar6 < 0x7fffffff) {
        uVar3 = (uint)uVar6;
      }
      (r1->S).r[1] = iVar9;
      (r1->S).r[0] = uVar3;
      local_9c = 0;
      if (uVar3 != 0) {
        uVar2 = (uint)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar3 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar9 = (int)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar3 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar3 = uVar2 + iVar9;
        local_9c = uVar2 + 0x80000001 + iVar9;
        if (uVar3 < 0x7fffffff) {
          local_9c = uVar3;
        }
      }
      local_48 = lVar4;
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_9c);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_9c;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar9 = (r2->S).r[0];
      uVar6 = (long)(r2->S).r[1] * (long)(r2->P).a[1] + (long)(r2->P).a[0] * (long)iVar9;
      uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
      uVar6 = uVar7 - 0xfffffffe;
      if (uVar7 < 0xfffffffe) {
        uVar6 = uVar7;
      }
      (r2->S).r[1] = iVar9;
      uVar3 = (uint)uVar6 + 0x80000001;
      if (uVar6 < 0x7fffffff) {
        uVar3 = (uint)uVar6;
      }
      (r2->S).r[0] = uVar3;
      if (uVar3 == 0) {
        local_9c = 0;
      }
      else {
        uVar2 = (uint)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar3 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar9 = (int)((ulong)*(uint *)(trng::yarn2::g + (ulong)(uVar3 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn2::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar3 = uVar2 + iVar9;
        local_9c = uVar2 + 0x80000001 + iVar9;
        if (uVar3 < 0x7fffffff) {
          local_9c = uVar3;
        }
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_9c);
      }
      else {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_9c;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_58) {
        lVar4 = local_58;
        iVar9 = (r1->S).r[0];
        iVar5 = (r1->S).r[1];
        do {
          iVar8 = iVar9;
          uVar6 = (long)iVar5 * (long)(r1->P).a[1] + (long)iVar8 * (long)(r1->P).a[0];
          uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
          uVar6 = uVar7 - 0xfffffffe;
          if (uVar7 < 0xfffffffe) {
            uVar6 = uVar7;
          }
          iVar9 = (int)uVar6 + -0x7fffffff;
          if (uVar6 < 0x7fffffff) {
            iVar9 = (int)uVar6;
          }
          lVar4 = lVar4 + -1;
          iVar5 = iVar8;
        } while (lVar4 != 0);
        (r1->S).r[1] = iVar8;
        (r1->S).r[0] = iVar9;
      }
      if (0 < local_50) {
        lVar4 = local_50;
        iVar9 = (r2->S).r[0];
        iVar5 = (r2->S).r[1];
        do {
          iVar8 = iVar9;
          uVar6 = (long)iVar5 * (long)(r2->P).a[1] + (long)iVar8 * (long)(r2->P).a[0];
          uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
          uVar6 = uVar7 - 0xfffffffe;
          if (uVar7 < 0xfffffffe) {
            uVar6 = uVar7;
          }
          iVar9 = (int)uVar6 + -0x7fffffff;
          if (uVar6 < 0x7fffffff) {
            iVar9 = (int)uVar6;
          }
          lVar4 = lVar4 + -1;
          iVar5 = iVar8;
        } while (lVar4 != 0);
        (r2->S).r[1] = iVar8;
        (r2->S).r[0] = iVar9;
      }
      lVar4 = local_48 + 1;
    } while (lVar4 != local_38);
  }
  p_Var1 = local_40;
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_40,&local_78,&local_98);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         p_Var1;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}